

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O0

bool __thiscall
libtorrent::torrent_info::parse_torrent_file
          (torrent_info *this,bdecode_node *torrent_file,error_code *ec,load_torrent_limits *cfg)

{
  sha256_hash *psVar1;
  undefined4 uVar2;
  bool bVar3;
  bool bVar4;
  type_t tVar5;
  int iVar6;
  int iVar7;
  size_type sVar8;
  size_type sVar9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  iterator iVar10;
  iterator iVar11;
  int64_t iVar12;
  ulong uVar13;
  error_code *in_R8;
  string_view sVar14;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar15;
  string_view uri_00;
  string_view url_00;
  string_view local_d90;
  string_view local_d80;
  string_view local_d70;
  string_view local_d60;
  string_view local_d50;
  string_view local_d40;
  string_view local_d30;
  string_view local_d20;
  string_view local_d10;
  string_view local_d00;
  string_view local_cf0;
  string_view local_ce0;
  _Base_ptr local_cd0;
  byte local_cc8;
  _Base_ptr local_cc0;
  byte local_cb8;
  uchar local_cab;
  uchar local_caa;
  bitfield_flag local_ca9;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_ca8;
  string local_c88;
  string_view local_c68;
  string local_c58;
  undefined1 local_c38 [8];
  web_seed_entry ent_1;
  bdecode_node url_1;
  int end_2;
  int i_3;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unique;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b58;
  string local_b38;
  string_view local_b18;
  string local_b08;
  undefined1 local_ae8 [8];
  web_seed_entry ent;
  undefined1 local_a78 [8];
  bdecode_node url_seeds;
  int64_t cd;
  int local_9dc;
  bdecode_node local_9d8;
  string_view local_998;
  byte local_981;
  bdecode_node local_980;
  byte local_939;
  bdecode_node local_938;
  undefined1 local_8f8 [8];
  bdecode_node n;
  int end_1;
  int i_2;
  undefined1 local_8a0 [8];
  bdecode_node nodes;
  string_view local_858;
  string_view local_848;
  string_view local_838;
  undefined1 local_828 [8];
  announce_entry e_2;
  string_view local_7a8;
  string_view local_798;
  undefined1 local_788 [8];
  announce_entry e_1;
  int end2;
  int k;
  bdecode_node tier;
  int end;
  int j;
  undefined1 local_6c8 [8];
  bdecode_node announce_node;
  char *local_680;
  undefined1 local_678 [8];
  bdecode_node str;
  undefined1 auStack_630 [4];
  int i_1;
  undefined1 local_620 [8];
  bdecode_node collections;
  char *local_5a0;
  bdecode_node local_598;
  bdecode_node local_558;
  int local_514;
  undefined1 auStack_510 [4];
  int i;
  undefined1 local_500 [8];
  bdecode_node similar;
  bdecode_node local_4b0;
  bdecode_node *local_470;
  bdecode_node *e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *url;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  undefined1 local_430 [8];
  add_torrent_params p;
  string_view local_d0;
  undefined1 local_c0 [8];
  bdecode_node uri;
  undefined1 local_70 [8];
  bdecode_node info;
  load_torrent_limits *cfg_local;
  error_code *ec_local;
  bdecode_node *torrent_file_local;
  torrent_info *this_local;
  
  info._56_8_ = cfg;
  tVar5 = bdecode_node::type(torrent_file);
  if (tVar5 != dict_t) {
    boost::system::error_code::operator=(ec,torrent_is_no_dict);
    this_local._7_1_ = 0;
    goto LAB_00738d77;
  }
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&uri.m_size,"info");
  bdecode_node::dict_find_dict((bdecode_node *)local_70,torrent_file,stack0xffffffffffffff80);
  bVar3 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_70);
  if (bVar3) {
    bVar3 = parse_info_section(this,(bdecode_node *)local_70,ec,*(int *)(info._56_8_ + 4));
    if (bVar3) {
      bVar3 = resolve_duplicate_filenames(this,*(int *)(info._56_8_ + 0x10),ec);
      if (bVar3) {
        bVar3 = info_hash_t::has_v2(&this->m_info_hash);
        if (bVar3) {
          ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)&similar.m_size,
                     "piece layers");
          bdecode_node::dict_find_dict(&local_4b0,torrent_file,stack0xfffffffffffffb40);
          local_470 = &local_4b0;
          bVar3 = bdecode_node::operator_cast_to_bool(local_470);
          if ((!bVar3) || (bVar3 = parse_piece_layers(this,local_470,ec), bVar3)) {
            bVar3 = false;
          }
          else {
            file_storage::set_piece_length(&this->m_files,0);
            this_local._7_1_ = 0;
            bVar3 = true;
          }
          bdecode_node::~bdecode_node(&local_4b0);
          if (bVar3) goto LAB_00738d61;
        }
        ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)auStack_510,"similar");
        bdecode_node::dict_find_list((bdecode_node *)local_500,torrent_file,_auStack_510);
        bVar3 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_500);
        if (bVar3) {
          for (local_514 = 0; iVar6 = local_514,
              iVar7 = bdecode_node::list_size((bdecode_node *)local_500), iVar6 < iVar7;
              local_514 = local_514 + 1) {
            bdecode_node::list_at(&local_558,(bdecode_node *)local_500,local_514);
            tVar5 = bdecode_node::type(&local_558);
            bdecode_node::~bdecode_node(&local_558);
            if (tVar5 == string_t) {
              bdecode_node::list_at(&local_598,(bdecode_node *)local_500,local_514);
              iVar6 = bdecode_node::string_length(&local_598);
              bdecode_node::~bdecode_node(&local_598);
              if (iVar6 == 0x14) {
                bdecode_node::list_at
                          ((bdecode_node *)&collections.m_size,(bdecode_node *)local_500,local_514);
                local_5a0 = bdecode_node::string_ptr((bdecode_node *)&collections.m_size);
                ::std::vector<libtorrent::digest32<160l>,std::allocator<libtorrent::digest32<160l>>>
                ::emplace_back<char_const*>
                          ((vector<libtorrent::digest32<160l>,std::allocator<libtorrent::digest32<160l>>>
                            *)&this->m_owned_similar_torrents,&local_5a0);
                bdecode_node::~bdecode_node((bdecode_node *)&collections.m_size);
              }
            }
          }
        }
        ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)auStack_630,"collections");
        bdecode_node::dict_find_list((bdecode_node *)local_620,torrent_file,_auStack_630);
        bVar3 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_620);
        if (bVar3) {
          for (str._60_4_ = 0; uVar2 = str._60_4_,
              iVar6 = bdecode_node::list_size((bdecode_node *)local_620), (int)uVar2 < iVar6;
              str._60_4_ = str._60_4_ + 1) {
            bdecode_node::list_at((bdecode_node *)local_678,(bdecode_node *)local_620,str._60_4_);
            tVar5 = bdecode_node::type((bdecode_node *)local_678);
            if (tVar5 == string_t) {
              local_680 = bdecode_node::string_ptr((bdecode_node *)local_678);
              iVar6 = bdecode_node::string_length((bdecode_node *)local_678);
              announce_node._56_8_ = libtorrent::aux::numeric_cast<unsigned_long,int,void>(iVar6);
              ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<char_const*,unsigned_long>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &this->m_owned_collections,&local_680,
                         (unsigned_long *)&announce_node.m_size);
            }
            bdecode_node::~bdecode_node((bdecode_node *)local_678);
          }
        }
        ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&end,"announce-list");
        bdecode_node::dict_find_list((bdecode_node *)local_6c8,torrent_file,_end);
        bVar3 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_6c8);
        if (bVar3) {
          iVar6 = bdecode_node::list_size((bdecode_node *)local_6c8);
          libtorrent::aux::
          container_wrapper<libtorrent::v1_2::announce_entry,int,std::vector<libtorrent::v1_2::announce_entry,std::allocator<libtorrent::v1_2::announce_entry>>>
          ::reserve<int,void>((container_wrapper<libtorrent::v1_2::announce_entry,int,std::vector<libtorrent::v1_2::announce_entry,std::allocator<libtorrent::v1_2::announce_entry>>>
                               *)&this->m_urls,iVar6);
          tier._60_4_ = 0;
          tier.m_size = bdecode_node::list_size((bdecode_node *)local_6c8);
          for (; (int)tier._60_4_ < tier.m_size; tier._60_4_ = tier._60_4_ + 1) {
            bdecode_node::list_at((bdecode_node *)&end2,(bdecode_node *)local_6c8,tier._60_4_);
            tVar5 = bdecode_node::type((bdecode_node *)&end2);
            if (tVar5 == list_t) {
              e_1._92_4_ = 0;
              e_1._88_4_ = bdecode_node::list_size((bdecode_node *)&end2);
              for (; uVar2 = e_1._92_4_, (int)e_1._92_4_ < (int)e_1._88_4_;
                  e_1._92_4_ = e_1._92_4_ + 1) {
                ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          (&local_7a8);
                sVar14 = bdecode_node::list_string_value_at((bdecode_node *)&end2,uVar2,local_7a8);
                local_798 = sVar14;
                v1_2::announce_entry::announce_entry((announce_entry *)local_788,sVar14);
                libtorrent::aux::ltrim((string *)local_788);
                uVar13 = ::std::__cxx11::string::empty();
                if ((uVar13 & 1) == 0) {
                  e_1.endpoints.
                  super__Vector_base<libtorrent::v1_2::announce_endpoint,_std::allocator<libtorrent::v1_2::announce_endpoint>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = tier._60_1_;
                  e_1.endpoints.
                  super__Vector_base<libtorrent::v1_2::announce_endpoint,_std::allocator<libtorrent::v1_2::announce_endpoint>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_1_ = 0;
                  e_1.endpoints.
                  super__Vector_base<libtorrent::v1_2::announce_endpoint,_std::allocator<libtorrent::v1_2::announce_endpoint>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ =
                       (e_1.endpoints.
                        super__Vector_base<libtorrent::v1_2::announce_endpoint,_std::allocator<libtorrent::v1_2::announce_endpoint>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ & 0xf0) + 1;
                  bVar3 = libtorrent::aux::is_i2p_url((string *)local_788);
                  if (bVar3) {
                    libtorrent::flags::
                    bitfield_flag<unsigned_char,_libtorrent::torrent_info_flags_tag,_void>::
                    operator|=(&this->m_flags,
                               (bitfield_flag<unsigned_char,_libtorrent::torrent_info_flags_tag,_void>
                                )'\x04');
                  }
                  ::std::
                  vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                  ::push_back(&(this->m_urls).
                               super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                              ,(value_type *)local_788);
                }
                v1_2::announce_entry::~announce_entry((announce_entry *)local_788);
              }
            }
            bdecode_node::~bdecode_node((bdecode_node *)&end2);
          }
          bVar3 = ::std::
                  vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                  ::empty(&(this->m_urls).
                           super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                         );
          if (!bVar3) {
            libtorrent::aux::
            random_shuffle<libtorrent::aux::container_wrapper<libtorrent::v1_2::announce_entry,int,std::vector<libtorrent::v1_2::announce_entry,std::allocator<libtorrent::v1_2::announce_entry>>>>
                      (&this->m_urls);
            iVar10 = ::std::
                     vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                     ::begin(&(this->m_urls).
                              super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                            );
            iVar11 = ::std::
                     vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                     ::end(&(this->m_urls).
                            super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                          );
            ::std::
            stable_sort<__gnu_cxx::__normal_iterator<libtorrent::v1_2::announce_entry*,std::vector<libtorrent::v1_2::announce_entry,std::allocator<libtorrent::v1_2::announce_entry>>>,libtorrent::torrent_info::parse_torrent_file(libtorrent::bdecode_node_const&,boost::system::error_code&,libtorrent::load_torrent_limits_const&)::__0>
                      (iVar10._M_current,iVar11._M_current);
          }
        }
        bVar3 = ::std::
                vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                ::empty(&(this->m_urls).
                         super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                       );
        if (bVar3) {
          ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_848,"announce");
          ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_858);
          local_838 = bdecode_node::dict_find_string_value(torrent_file,local_848,local_858);
          v1_2::announce_entry::announce_entry((announce_entry *)local_828,local_838);
          e_2.endpoints.
          super__Vector_base<libtorrent::v1_2::announce_endpoint,_std::allocator<libtorrent::v1_2::announce_endpoint>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._1_1_ = 0;
          e_2.endpoints.
          super__Vector_base<libtorrent::v1_2::announce_endpoint,_std::allocator<libtorrent::v1_2::announce_endpoint>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ =
               (e_2.endpoints.
                super__Vector_base<libtorrent::v1_2::announce_endpoint,_std::allocator<libtorrent::v1_2::announce_endpoint>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ & 0xf0) + 1;
          libtorrent::aux::ltrim((string *)local_828);
          bVar3 = libtorrent::aux::is_i2p_url((string *)local_828);
          if (bVar3) {
            nodes._63_1_ = '\x04';
            libtorrent::flags::
            bitfield_flag<unsigned_char,_libtorrent::torrent_info_flags_tag,_void>::operator|=
                      (&this->m_flags,
                       (bitfield_flag<unsigned_char,_libtorrent::torrent_info_flags_tag,_void>)
                       '\x04');
          }
          uVar13 = ::std::__cxx11::string::empty();
          if ((uVar13 & 1) == 0) {
            ::std::
            vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
            ::push_back(&(this->m_urls).
                         super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                        ,(value_type *)local_828);
          }
          v1_2::announce_entry::~announce_entry((announce_entry *)local_828);
        }
        ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&end_1,"nodes");
        bdecode_node::dict_find_list((bdecode_node *)local_8a0,torrent_file,_end_1);
        bVar3 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_8a0);
        if (bVar3) {
          n._60_4_ = 0;
          n.m_size = bdecode_node::list_size((bdecode_node *)local_8a0);
          for (; (int)n._60_4_ < n.m_size; n._60_4_ = n._60_4_ + 1) {
            bdecode_node::list_at((bdecode_node *)local_8f8,(bdecode_node *)local_8a0,n._60_4_);
            tVar5 = bdecode_node::type((bdecode_node *)local_8f8);
            local_939 = 0;
            local_981 = 0;
            bVar3 = true;
            if (tVar5 == list_t) {
              iVar6 = bdecode_node::list_size((bdecode_node *)local_8f8);
              bVar3 = true;
              if (1 < iVar6) {
                bdecode_node::list_at(&local_938,(bdecode_node *)local_8f8,0);
                local_939 = 1;
                tVar5 = bdecode_node::type(&local_938);
                bVar3 = true;
                if (tVar5 == string_t) {
                  bdecode_node::list_at(&local_980,(bdecode_node *)local_8f8,1);
                  local_981 = 1;
                  tVar5 = bdecode_node::type(&local_980);
                  bVar3 = tVar5 != int_t;
                }
              }
            }
            if ((local_981 & 1) != 0) {
              bdecode_node::~bdecode_node(&local_980);
            }
            if ((local_939 & 1) != 0) {
              bdecode_node::~bdecode_node(&local_938);
            }
            if (!bVar3) {
              bdecode_node::list_at(&local_9d8,(bdecode_node *)local_8f8,0);
              sVar14 = bdecode_node::string_value(&local_9d8);
              local_998 = sVar14;
              bdecode_node::list_at((bdecode_node *)&cd,(bdecode_node *)local_8f8,1);
              iVar12 = bdecode_node::int_value((bdecode_node *)&cd);
              local_9dc = (int)iVar12;
              ::std::
              vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>
              ::emplace_back<std::basic_string_view<char,std::char_traits<char>>,int>
                        ((vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>
                          *)&this->m_nodes,&local_998,&local_9dc);
              bdecode_node::~bdecode_node((bdecode_node *)&cd);
              bdecode_node::~bdecode_node(&local_9d8);
            }
            bdecode_node::~bdecode_node((bdecode_node *)local_8f8);
          }
        }
        ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&url_seeds.m_size,
                   "creation date");
        iVar12 = bdecode_node::dict_find_int_value(torrent_file,stack0xfffffffffffff5c8,-1);
        if (-1 < iVar12) {
          this->m_creation_date = iVar12;
        }
        ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&ent.type,"url-list");
        bdecode_node::dict_find((bdecode_node *)local_a78,torrent_file,stack0xfffffffffffff578);
        bVar3 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_a78);
        if (bVar3) {
          tVar5 = bdecode_node::type((bdecode_node *)local_a78);
          if (tVar5 != string_t) goto LAB_0073862f;
          iVar6 = bdecode_node::string_length((bdecode_node *)local_a78);
          if (iVar6 < 1) goto LAB_0073862f;
          local_b18 = bdecode_node::string_value((bdecode_node *)local_a78);
          sVar14._M_len = local_b18._M_str;
          sVar14._M_str = (char *)local_b18._M_len;
          maybe_url_encode_abi_cxx11_(&local_b08,(libtorrent *)local_b18._M_len,sVar14);
          ::std::__cxx11::string::string((string *)&local_b38);
          local_b58.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_b58.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_b58.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ::std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::vector(&local_b58);
          web_seed_entry::web_seed_entry
                    ((web_seed_entry *)local_ae8,&local_b08,&local_b38,&local_b58);
          ::std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~vector(&local_b58);
          ::std::__cxx11::string::~string((string *)&local_b38);
          ::std::__cxx11::string::~string((string *)&local_b08);
          unique._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = (this->m_flags).m_val;
          unique._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_ = '\x01';
          unique._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ =
               libtorrent::flags::operator&
                         (unique._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_,
                          (bitfield_flag<unsigned_char,_libtorrent::torrent_info_flags_tag,_void>)
                          '\x01');
          bVar4 = libtorrent::flags::bitfield_flag::operator_cast_to_bool
                            ((bitfield_flag *)
                             ((long)&unique._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
          bVar3 = false;
          if (bVar4) {
            iVar6 = num_files(this);
            bVar3 = 1 < iVar6;
          }
          if (bVar3) {
            libtorrent::aux::ensure_trailing_slash((string *)local_ae8);
          }
          ::std::vector<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>::
          push_back(&this->m_web_seeds,(value_type *)local_ae8);
          web_seed_entry::~web_seed_entry((web_seed_entry *)local_ae8);
        }
        else {
LAB_0073862f:
          bVar3 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_a78);
          if (bVar3) {
            tVar5 = bdecode_node::type((bdecode_node *)local_a78);
            if (tVar5 == list_t) {
              ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&end_2);
              url_1._60_4_ = 0;
              iVar6 = bdecode_node::list_size((bdecode_node *)local_a78);
              for (; (int)url_1._60_4_ < iVar6; url_1._60_4_ = url_1._60_4_ + 1) {
                bdecode_node::list_at
                          ((bdecode_node *)&ent_1.type,(bdecode_node *)local_a78,url_1._60_4_);
                tVar5 = bdecode_node::type((bdecode_node *)&ent_1.type);
                if (tVar5 == string_t) {
                  iVar7 = bdecode_node::string_length((bdecode_node *)&ent_1.type);
                  if (iVar7 != 0) {
                    sVar14 = bdecode_node::string_value((bdecode_node *)&ent_1.type);
                    url_00._M_len = sVar14._M_str;
                    url_00._M_str = (char *)sVar14._M_len;
                    local_c68 = sVar14;
                    maybe_url_encode_abi_cxx11_(&local_c58,(libtorrent *)sVar14._M_len,url_00);
                    ::std::__cxx11::string::string((string *)&local_c88);
                    local_ca8.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                    local_ca8.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                    local_ca8.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    ::std::
                    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::vector(&local_ca8);
                    web_seed_entry::web_seed_entry
                              ((web_seed_entry *)local_c38,&local_c58,&local_c88,&local_ca8);
                    ::std::
                    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::~vector(&local_ca8);
                    ::std::__cxx11::string::~string((string *)&local_c88);
                    ::std::__cxx11::string::~string((string *)&local_c58);
                    local_caa = (this->m_flags).m_val;
                    local_cab = '\x01';
                    local_ca9 = (bitfield_flag)
                                libtorrent::flags::operator&
                                          ((bitfield_flag<unsigned_char,_libtorrent::torrent_info_flags_tag,_void>
                                            )local_caa,
                                           (bitfield_flag<unsigned_char,_libtorrent::torrent_info_flags_tag,_void>
                                            )'\x01');
                    bVar4 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_ca9);
                    bVar3 = false;
                    if (bVar4) {
                      iVar7 = num_files(this);
                      bVar3 = 1 < iVar7;
                    }
                    if (bVar3) {
                      libtorrent::aux::ensure_trailing_slash((string *)local_c38);
                    }
                    pVar15 = ::std::
                             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)&end_2,(value_type *)local_c38);
                    local_cd0 = (_Base_ptr)pVar15.first._M_node;
                    local_cc8 = pVar15.second;
                    local_cc0 = local_cd0;
                    local_cb8 = local_cc8;
                    if (((local_cc8 ^ 0xff) & 1) == 0) {
                      ::std::
                      vector<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>
                      ::push_back(&this->m_web_seeds,(value_type *)local_c38);
                    }
                    web_seed_entry::~web_seed_entry((web_seed_entry *)local_c38);
                  }
                }
                bdecode_node::~bdecode_node((bdecode_node *)&ent_1.type);
              }
              ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&end_2);
            }
          }
        }
        ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_cf0,"comment.utf-8");
        ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_d00);
        local_ce0 = bdecode_node::dict_find_string_value(torrent_file,local_cf0,local_d00);
        ::std::__cxx11::string::operator=((string *)&this->m_comment,&local_ce0);
        uVar13 = ::std::__cxx11::string::empty();
        if ((uVar13 & 1) != 0) {
          ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_d20,"comment");
          ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_d30);
          local_d10 = bdecode_node::dict_find_string_value(torrent_file,local_d20,local_d30);
          ::std::__cxx11::string::operator=((string *)&this->m_comment,&local_d10);
        }
        libtorrent::aux::verify_encoding(&this->m_comment);
        ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_d50,"created by.utf-8");
        ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_d60);
        local_d40 = bdecode_node::dict_find_string_value(torrent_file,local_d50,local_d60);
        ::std::__cxx11::string::operator=((string *)&this->m_created_by,&local_d40);
        uVar13 = ::std::__cxx11::string::empty();
        if ((uVar13 & 1) != 0) {
          ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_d80,"created by");
          ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_d90);
          local_d70 = bdecode_node::dict_find_string_value(torrent_file,local_d80,local_d90);
          ::std::__cxx11::string::operator=((string *)&this->m_created_by,&local_d70);
        }
        libtorrent::aux::verify_encoding(&this->m_created_by);
        this_local._7_1_ = 1;
        bdecode_node::~bdecode_node((bdecode_node *)local_a78);
        bdecode_node::~bdecode_node((bdecode_node *)local_8a0);
        bdecode_node::~bdecode_node((bdecode_node *)local_6c8);
        bdecode_node::~bdecode_node((bdecode_node *)local_620);
        bdecode_node::~bdecode_node((bdecode_node *)local_500);
      }
      else {
        this_local._7_1_ = 0;
      }
    }
    else {
      this_local._7_1_ = 0;
    }
  }
  else {
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_d0,"magnet-uri");
    bdecode_node::dict_find_string((bdecode_node *)local_c0,torrent_file,local_d0);
    bVar3 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_c0);
    if (bVar3) {
      sVar14 = bdecode_node::string_value((bdecode_node *)local_c0);
      uri_00._M_len = sVar14._M_str;
      uri_00._M_str = (char *)ec;
      parse_magnet_uri((add_torrent_params *)local_430,(libtorrent *)sVar14._M_len,uri_00,in_R8);
      bVar3 = boost::system::error_code::operator_cast_to_bool(ec);
      if (bVar3) {
        this_local._7_1_ = 0;
      }
      else {
        (this->m_info_hash).v2.m_number._M_elems[7] = p.info_hashes.v2.m_number._M_elems[5];
        *(undefined8 *)((this->m_info_hash).v2.m_number._M_elems + 3) =
             p.info_hashes.v2.m_number._M_elems._4_8_;
        *(undefined8 *)((this->m_info_hash).v2.m_number._M_elems + 5) =
             p.info_hashes.v2.m_number._M_elems._12_8_;
        *(undefined8 *)((this->m_info_hash).v1.m_number._M_elems + 4) =
             p.info_hashes.v1.m_number._M_elems._8_8_;
        psVar1 = &(this->m_info_hash).v2;
        (psVar1->m_number)._M_elems[1] = p.info_hashes.v1.m_number._M_elems[4];
        (psVar1->m_number)._M_elems[2] = p.info_hashes.v2.m_number._M_elems[0];
        *(undefined8 *)(this->m_info_hash).v1.m_number._M_elems =
             p.info_hash.m_number._M_elems._12_8_;
        *(undefined8 *)((this->m_info_hash).v1.m_number._M_elems + 2) =
             p.info_hashes.v1.m_number._M_elems._0_8_;
        sVar8 = ::std::
                vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                ::size(&(this->m_urls).
                        super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                      );
        sVar9 = ::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&p.ti.
                           super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount);
        libtorrent::aux::
        container_wrapper<libtorrent::v1_2::announce_entry,_int,_std::vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>_>
        ::reserve(&this->m_urls,sVar8 + sVar9);
        this_00 = &p.ti.super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount;
        __end3 = ::std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)this_00);
        url = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this_00);
        while (bVar3 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&url), bVar3) {
          e = (bdecode_node *)
              __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&__end3);
          ::std::
          vector<libtorrent::v1_2::announce_entry,std::allocator<libtorrent::v1_2::announce_entry>>
          ::emplace_back<std::__cxx11::string_const&>
                    ((vector<libtorrent::v1_2::announce_entry,std::allocator<libtorrent::v1_2::announce_entry>>
                      *)&this->m_urls,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)e);
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end3);
        }
        this_local._7_1_ = 1;
      }
      add_torrent_params::~add_torrent_params((add_torrent_params *)local_430);
    }
    else {
      boost::system::error_code::operator=(ec,torrent_missing_info);
      this_local._7_1_ = 0;
    }
    bdecode_node::~bdecode_node((bdecode_node *)local_c0);
  }
LAB_00738d61:
  bdecode_node::~bdecode_node((bdecode_node *)local_70);
LAB_00738d77:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool torrent_info::parse_torrent_file(bdecode_node const& torrent_file
		, error_code& ec, load_torrent_limits const& cfg)
	{
		if (torrent_file.type() != bdecode_node::dict_t)
		{
			ec = errors::torrent_is_no_dict;
			return false;
		}

		bdecode_node const info = torrent_file.dict_find_dict("info");
		if (!info)
		{
			bdecode_node const uri = torrent_file.dict_find_string("magnet-uri");
			if (uri)
			{
				auto const p = parse_magnet_uri(uri.string_value(), ec);
				if (ec) return false;

				m_info_hash = p.info_hashes;
				m_urls.reserve(m_urls.size() + p.trackers.size());
				for (auto const& url : p.trackers)
					m_urls.emplace_back(url);

				return true;
			}

			ec = errors::torrent_missing_info;
			return false;
		}

		if (!parse_info_section(info, ec, cfg.max_pieces)) return false;
		if (!resolve_duplicate_filenames(cfg.max_duplicate_filenames, ec)) return false;

		if (m_info_hash.has_v2())
		{
			// allow torrent files without piece layers, just like we allow magnet
			// links. However, if there are piece layers, make sure they're
			// valid
			bdecode_node const& e = torrent_file.dict_find_dict("piece layers");
			if (e && !parse_piece_layers(e, ec))
			{
				TORRENT_ASSERT(ec);
				// mark the torrent as invalid
				m_files.set_piece_length(0);
				return false;
			}
		}

#ifndef TORRENT_DISABLE_MUTABLE_TORRENTS
		bdecode_node const similar = torrent_file.dict_find_list("similar");
		if (similar)
		{
			for (int i = 0; i < similar.list_size(); ++i)
			{
				if (similar.list_at(i).type() != bdecode_node::string_t)
					continue;

				if (similar.list_at(i).string_length() != 20)
					continue;

				m_owned_similar_torrents.emplace_back(
					similar.list_at(i).string_ptr());
			}
		}

		bdecode_node const collections = torrent_file.dict_find_list("collections");
		if (collections)
		{
			for (int i = 0; i < collections.list_size(); ++i)
			{
				bdecode_node const str = collections.list_at(i);

				if (str.type() != bdecode_node::string_t) continue;

				m_owned_collections.emplace_back(str.string_ptr()
					, aux::numeric_cast<std::size_t>(str.string_length()));
			}
		}
#endif // TORRENT_DISABLE_MUTABLE_TORRENTS

		// extract the url of the tracker
		bdecode_node const announce_node = torrent_file.dict_find_list("announce-list");
		if (announce_node)
		{
			m_urls.reserve(announce_node.list_size());
			for (int j = 0, end(announce_node.list_size()); j < end; ++j)
			{
				bdecode_node const tier = announce_node.list_at(j);
				if (tier.type() != bdecode_node::list_t) continue;
				for (int k = 0, end2(tier.list_size()); k < end2; ++k)
				{
					announce_entry e(tier.list_string_value_at(k));
					aux::ltrim(e.url);
					if (e.url.empty()) continue;
					e.tier = std::uint8_t(j);
					e.fail_limit = 0;
					e.source = announce_entry::source_torrent;
#if TORRENT_USE_I2P
					if (aux::is_i2p_url(e.url)) m_flags |= i2p;
#endif
					m_urls.push_back(e);
				}
			}

			if (!m_urls.empty())
			{
				// shuffle each tier
				aux::random_shuffle(m_urls);
				std::stable_sort(m_urls.begin(), m_urls.end()
					, [](announce_entry const& lhs, announce_entry const& rhs)
					{ return lhs.tier < rhs.tier; });
			}
		}

		if (m_urls.empty())
		{
			announce_entry e(torrent_file.dict_find_string_value("announce"));
			e.fail_limit = 0;
			e.source = announce_entry::source_torrent;
			aux::ltrim(e.url);
#if TORRENT_USE_I2P
			if (aux::is_i2p_url(e.url)) m_flags |= i2p;
#endif
			if (!e.url.empty()) m_urls.push_back(e);
		}

		bdecode_node const nodes = torrent_file.dict_find_list("nodes");
		if (nodes)
		{
			for (int i = 0, end(nodes.list_size()); i < end; ++i)
			{
				bdecode_node const n = nodes.list_at(i);
				if (n.type() != bdecode_node::list_t
					|| n.list_size() < 2
					|| n.list_at(0).type() != bdecode_node::string_t
					|| n.list_at(1).type() != bdecode_node::int_t)
					continue;
				m_nodes.emplace_back(
					n.list_at(0).string_value()
					, int(n.list_at(1).int_value()));
			}
		}

		// extract creation date
		std::int64_t const cd = torrent_file.dict_find_int_value("creation date", -1);
		if (cd >= 0)
		{
			m_creation_date = std::time_t(cd);
		}

		// if there are any url-seeds, extract them
		bdecode_node const url_seeds = torrent_file.dict_find("url-list");
		if (url_seeds && url_seeds.type() == bdecode_node::string_t
			&& url_seeds.string_length() > 0)
		{
			web_seed_entry ent(maybe_url_encode(url_seeds.string_value()));
			if ((m_flags & multifile) && num_files() > 1)
				aux::ensure_trailing_slash(ent.url);
			m_web_seeds.push_back(std::move(ent));
		}
		else if (url_seeds && url_seeds.type() == bdecode_node::list_t)
		{
			// only add a URL once
			std::set<std::string> unique;
			for (int i = 0, end(url_seeds.list_size()); i < end; ++i)
			{
				bdecode_node const url = url_seeds.list_at(i);
				if (url.type() != bdecode_node::string_t) continue;
				if (url.string_length() == 0) continue;
				web_seed_entry ent(maybe_url_encode(url.string_value()));
				if ((m_flags & multifile) && num_files() > 1)
					aux::ensure_trailing_slash(ent.url);
				if (!unique.insert(ent.url).second) continue;
				m_web_seeds.push_back(std::move(ent));
			}
		}

		m_comment = torrent_file.dict_find_string_value("comment.utf-8");
		if (m_comment.empty()) m_comment = torrent_file.dict_find_string_value("comment");
		aux::verify_encoding(m_comment);

		m_created_by = torrent_file.dict_find_string_value("created by.utf-8");
		if (m_created_by.empty()) m_created_by = torrent_file.dict_find_string_value("created by");
		aux::verify_encoding(m_created_by);

		return true;
	}